

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O0

bool crnlib::file_utils::split_path
               (char *p,dynamic_string *pDrive,dynamic_string *pDir,dynamic_string *pFilename,
               dynamic_string *pExt)

{
  bool bVar1;
  char cVar2;
  dynamic_string local_858;
  char *local_848;
  char *pBaseName;
  char *pDirName;
  char nametmp [1024];
  char dirtmp [1024];
  dynamic_string *pExt_local;
  dynamic_string *pFilename_local;
  dynamic_string *pDir_local;
  dynamic_string *pDrive_local;
  char *p_local;
  
  strcpy_safe(nametmp + 0x3f8,0x400,p);
  strcpy_safe((char *)&pDirName,0x400,p);
  if (pDrive != (dynamic_string *)0x0) {
    dynamic_string::clear(pDrive);
  }
  pBaseName = dirname(nametmp + 0x3f8);
  if (pBaseName == (char *)0x0) {
    p_local._7_1_ = false;
  }
  else {
    if (pDir != (dynamic_string *)0x0) {
      dynamic_string::set(pDir,pBaseName,0xffffffff);
      bVar1 = dynamic_string::is_empty(pDir);
      if ((!bVar1) && (cVar2 = dynamic_string::back(pDir), cVar2 != '/')) {
        dynamic_string::append_char(pDir,'/');
      }
    }
    local_848 = __xpg_basename((char *)&pDirName);
    if (local_848 == (char *)0x0) {
      p_local._7_1_ = false;
    }
    else {
      if (pFilename != (dynamic_string *)0x0) {
        dynamic_string::set(pFilename,local_848,0xffffffff);
        remove_extension(pFilename);
      }
      if (pExt != (dynamic_string *)0x0) {
        dynamic_string::set(pExt,local_848,0xffffffff);
        get_extension(pExt);
        operator+((crnlib *)&local_858,".",pExt);
        dynamic_string::operator=(pExt,&local_858);
        dynamic_string::~dynamic_string(&local_858);
      }
      p_local._7_1_ = true;
    }
  }
  return p_local._7_1_;
}

Assistant:

bool file_utils::split_path(const char* p, dynamic_string* pDrive, dynamic_string* pDir, dynamic_string* pFilename, dynamic_string* pExt)
    {
        CRNLIB_ASSERT(p);

#ifdef WIN32
        char drive_buf[_MAX_DRIVE];
        char dir_buf[_MAX_DIR];
        char fname_buf[_MAX_FNAME];
        char ext_buf[_MAX_EXT];

#ifdef _MSC_VER
        // Compiling with MSVC
        errno_t error = _splitpath_s(p,
            pDrive ? drive_buf : nullptr, pDrive ? _MAX_DRIVE : 0,
            pDir ? dir_buf : nullptr, pDir ? _MAX_DIR : 0,
            pFilename ? fname_buf : nullptr, pFilename ? _MAX_FNAME : 0,
            pExt ? ext_buf : nullptr, pExt ? _MAX_EXT : 0);
        if (error != 0)
        {
            return false;
        }
#else
        // Compiling with MinGW
        _splitpath(p,
            pDrive ? drive_buf : nullptr,
            pDir ? dir_buf : nullptr,
            pFilename ? fname_buf : nullptr,
            pExt ? ext_buf : nullptr);
#endif

        if (pDrive)
        {
            *pDrive = drive_buf;
        }
        if (pDir)
        {
            *pDir = dir_buf;
        }
        if (pFilename)
        {
            *pFilename = fname_buf;
        }
        if (pExt)
        {
            *pExt = ext_buf;
        }
#else
        char dirtmp[1024];
        char nametmp[1024];
        strcpy_safe(dirtmp, sizeof(dirtmp), p);
        strcpy_safe(nametmp, sizeof(nametmp), p);

        if (pDrive)
        {
            pDrive->clear();
        }

        const char* pDirName = dirname(dirtmp);
        if (!pDirName)
        {
            return false;
        }

        if (pDir)
        {
            pDir->set(pDirName);
            if ((!pDir->is_empty()) && (pDir->back() != '/'))
            {
                pDir->append_char('/');
            }
        }

        const char* pBaseName = basename(nametmp);
        if (!pBaseName)
        {
            return false;
        }

        if (pFilename)
        {
            pFilename->set(pBaseName);
            remove_extension(*pFilename);
        }

        if (pExt)
        {
            pExt->set(pBaseName);
            get_extension(*pExt);
            *pExt = "." + *pExt;
        }
#endif  // #ifdef WIN32

        return true;
    }